

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

ssize_t __thiscall
mprpc::MpRpcServer::send(MpRpcServer *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined1 uVar1;
  int iVar2;
  element_type *peVar3;
  ulong uVar4;
  undefined1 *puVar5;
  undefined1 *extraout_RAX;
  undefined4 in_register_00000034;
  __shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  bool r;
  char *buf;
  size_t len;
  size_t size_local;
  void *data_local;
  shared_ptr<mprpc::ClientConnection> *conn_local;
  MpRpcServer *this_local;
  
  this_00 = (__shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)CONCAT44(in_register_00000034,__fd);
  len = __n;
  size_local = (size_t)__buf;
  data_local = this_00;
  conn_local = (shared_ptr<mprpc::ClientConnection> *)this;
  peVar3 = std::
           __shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_00);
  iVar2 = (**(code **)(*(long *)peVar3 + 0x18))();
  if (__n < (ulong)(long)iVar2) {
    peVar3 = std::
             __shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    uVar4 = (**(code **)(*(long *)peVar3 + 0x20))(peVar3,size_local,len);
    uVar4 = uVar4 & 0xffffffffffffff01;
    this_local._7_1_ = (undefined1)uVar4;
  }
  else {
    buf = (char *)snappy::MaxCompressedLength(len);
    puVar5 = (undefined1 *)operator_new__((ulong)(buf + 5));
    *puVar5 = 0x53;
    *(int *)(puVar5 + 1) = (int)len;
    snappy::RawCompress((char *)size_local,len,puVar5 + 5,(size_t *)&buf);
    peVar3 = std::
             __shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    uVar1 = (**(code **)(*(long *)peVar3 + 0x20))(peVar3,puVar5,buf + 5);
    if (puVar5 != (undefined1 *)0x0) {
      operator_delete__(puVar5);
      puVar5 = extraout_RAX;
    }
    uVar4 = CONCAT71((int7)((ulong)puVar5 >> 8),uVar1) & 0xffffffffffffff01;
    this_local._7_1_ = (undefined1)uVar4;
  }
  return CONCAT71((int7)(uVar4 >> 8),this_local._7_1_);
}

Assistant:

bool MpRpcServer::send(shared_ptr<ClientConnection> conn, const void* data, size_t size)
    {
        if (size < (size_t)conn->max_raw_size()) {
            return conn->send((const char*)data, size);
        }
        else {
            //static uint64_t time1;
            //static uint64_t time2;
            //static uint64_t count;
            //auto begin_time = system_clock::now();

            size_t len = snappy::MaxCompressedLength(size);
            char* buf = new char[5 + len];
            buf[0] = 'S';
            *(uint32_t*)(buf + 1) = (uint32_t)size;
            snappy::RawCompress((const char*)data, size, buf + 5, &len);

            //time1 += duration_cast<microseconds>(system_clock::now() - begin_time).count();

            bool r = conn->send (buf, len + 5);
            delete[] buf;

            //time2 += duration_cast<microseconds>(system_clock::now() - begin_time).count();

            //count++;
            //if (count == 20) {
            //    std::cout << "send time: " << (time1 / count) << "," << (time2 / count) << endl;
            //    time1 = time2 = 0;
            //    count = 0;
            //}

            return r;
        }
    }